

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseNamedModel_Test::~Parser_parseNamedModel_Test(Parser_parseNamedModel_Test *this)

{
  Parser_parseNamedModel_Test *this_local;
  
  ~Parser_parseNamedModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseNamedModel)
{
    const std::string n = "name";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"name\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(n, model->name());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}